

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O3

void __thiscall zmq::message_t::message_t<int_const*>(message_t *this,int *first,int *last)

{
  int iVar1;
  void *__dest;
  error_t *this_00;
  size_t __n;
  
  __n = (long)last - (long)first;
  if ((long)__n < 0) {
    __assert_fail("std::distance(first, last) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq.hpp",0x1ad,
                  "zmq::message_t::message_t(ForwardIter, ForwardIter) [ForwardIter = const int *]")
    ;
  }
  iVar1 = zmq_msg_init_size(this,__n);
  if (iVar1 == 0) {
    __dest = (void *)zmq_msg_data(this);
    if (last != first) {
      memmove(__dest,first,__n);
      return;
    }
    return;
  }
  this_00 = (error_t *)__cxa_allocate_exception(0x10);
  error_t::error_t(this_00);
  __cxa_throw(this_00,&error_t::typeinfo,std::exception::~exception);
}

Assistant:

message_t(ForwardIter first, ForwardIter last)
    {
        typedef typename std::iterator_traits<ForwardIter>::value_type value_t;

        assert(std::distance(first, last) >= 0);
        size_t const size_ =
          static_cast<size_t>(std::distance(first, last)) * sizeof(value_t);
        int const rc = zmq_msg_init_size(&msg, size_);
        if (rc != 0)
            throw error_t();
        std::copy(first, last, data<value_t>());
    }